

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O0

void __thiscall
OpenMesh::
PropertyT<OpenMesh::DefaultTraits::FaceT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>
::PropertyT(PropertyT<OpenMesh::DefaultTraits::FaceT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>
            *this,PropertyT<OpenMesh::DefaultTraits::FaceT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>
                  *_rhs)

{
  PropertyT<OpenMesh::DefaultTraits::FaceT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>
  *_rhs_local;
  PropertyT<OpenMesh::DefaultTraits::FaceT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>
  *this_local;
  
  BaseProperty::BaseProperty(&this->super_BaseProperty,&_rhs->super_BaseProperty);
  (this->super_BaseProperty)._vptr_BaseProperty = (_func_int **)&PTR__PropertyT_003dd718;
  std::
  vector<OpenMesh::DefaultTraits::FaceT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>,_std::allocator<OpenMesh::DefaultTraits::FaceT<OpenMesh::FinalMeshItemsT<MyTraits,_true>::ITraits,_OpenMesh::FinalMeshItemsT<MyTraits,_true>::Refs>_>_>
  ::vector(&this->data_,&_rhs->data_);
  return;
}

Assistant:

PropertyT(const PropertyT & _rhs)
      : BaseProperty( _rhs ), data_( _rhs.data_ ) {}